

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

size_t cpptrace::safe_generate_raw_trace(frame_ptr *buffer,size_t size,size_t skip)

{
  size_t sVar1;
  
  sVar1 = detail::safe_capture_frames(buffer,size,skip + 1,0xffffffffffffffff);
  return sVar1;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    std::size_t safe_generate_raw_trace(frame_ptr* buffer, std::size_t size, std::size_t skip) {
        try { // try/catch can never be hit but it's needed to prevent TCO
            return detail::safe_capture_frames(buffer, size, skip + 1, SIZE_MAX);
        } catch(...) {
            if(!detail::should_absorb_trace_exceptions()) {
                throw;
            }
            return 0;
        }
    }